

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O2

int __thiscall
opengv::absolute_pose::OptimizeNonlinearFunctor1::operator()
          (OptimizeNonlinearFunctor1 *this,VectorXd *x,VectorXd *fvec)

{
  Indices *pIVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  size_t i;
  ulong uVar6;
  Scalar SVar7;
  undefined1 auVar8 [16];
  point_t reprojection;
  point_t bodyReprojection;
  translation_t translation;
  Matrix<double,_4,_1,_0,_4,_1> p_hom;
  transformation_t inverseSolution;
  cayley_t cayley;
  rotation_t rotation;
  undefined1 local_238 [16];
  scalar_constant_op<double> local_228;
  variable_if_dynamic<long,__1> local_220;
  variable_if_dynamic<long,__1> vStack_218;
  Index local_210;
  Matrix<double,_3,_1,_0,_3,_1> *local_200;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *local_1f0;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *local_1e8;
  undefined1 *local_1e0;
  double local_1d0;
  double dStack_1c8;
  double local_1c0;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_1b0 [24];
  Matrix<double,_3,_1,_0,_3,_1> local_198;
  undefined1 local_180 [64];
  Matrix<double,_3,_1,_0,_3,_1> local_140;
  double local_128;
  Index local_118;
  undefined1 local_f8 [88];
  rotation_t local_a0;
  
  local_140.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (double)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  local_118 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  local_128 = 0.0;
  local_140.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (double)x;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_198,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
             &local_140);
  local_118 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  local_140.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (double)((x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               + 3);
  local_128 = 1.48219693752374e-323;
  local_140.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (double)x;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)(local_f8 + 0x40),
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
             &local_140);
  math::cayley2rot(&local_a0,(cayley_t *)(local_f8 + 0x40));
  local_220.m_value = 0;
  vStack_218.m_value = 0;
  local_210 = 3;
  local_238._0_8_ =
       (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
       &local_140;
  local_228.m_other = (double)&local_140;
  local_180._0_8_ = &local_a0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>
            ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false> *)local_238,
             (Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_180);
  local_180._0_8_ = local_f8;
  local_200 = &local_198;
  local_180._24_8_ = 0;
  local_220.m_value = 0;
  vStack_218.m_value = 0;
  local_210 = 3;
  local_180._32_8_ = 3;
  local_180._40_8_ = 1.48219693752374e-323;
  local_238._0_8_ =
       (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
       &local_140;
  local_228.m_other = (double)&local_140;
  local_180._16_8_ =
       (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
       &local_140;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,1,true>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>const>,Eigen::Matrix<double,3,1,0,3,1>,0>>
            ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true> *)local_180,
             (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
              *)local_238);
  lVar4 = 0;
  local_180._24_8_ = 0x3ff0000000000000;
  for (uVar6 = 0; pIVar1 = this->_indices, uVar6 < pIVar1->_numberCorrespondences; uVar6 = uVar6 + 1
      ) {
    iVar5 = (int)uVar6;
    lVar3 = lVar4 >> 0x1e;
    iVar2 = iVar5;
    if (pIVar1->_useIndices != false) {
      iVar2 = *(int *)((long)(pIVar1->_indices->super__Vector_base<int,_std::allocator<int>_>).
                             _M_impl.super__Vector_impl_data._M_start + lVar3);
    }
    (*this->_adapter->_vptr_AbsoluteAdapterBase[6])
              ((dense_product_base *)&local_1f0,this->_adapter,(long)iVar2);
    local_220.m_value = 0;
    local_210 = 4;
    local_238._0_8_ = (XprTypeNested)local_180;
    local_228.m_other = (double)local_180;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,3,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_3,_1,_false> *)local_238,
               (Matrix<double,_3,_1,_0,_3,_1> *)&local_1f0);
    local_238._0_8_ = &local_140;
    local_238._8_8_ = (XprTypeNested)local_180;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Product<Eigen::Matrix<double,3,4,0,3,4>,Eigen::Matrix<double,4,1,0,4,1>,0>>
              (local_1b0,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>_>
                *)local_238);
    iVar2 = iVar5;
    if (this->_indices->_useIndices != false) {
      iVar2 = *(int *)((long)(this->_indices->_indices->
                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar3);
    }
    (*this->_adapter->_vptr_AbsoluteAdapterBase[5])(local_238,this->_adapter,(long)iVar2);
    iVar2 = iVar5;
    if (this->_indices->_useIndices != false) {
      iVar2 = *(int *)((long)(this->_indices->_indices->
                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar3);
    }
    (*this->_adapter->_vptr_AbsoluteAdapterBase[4])(local_f8 + 0x28,this->_adapter,(long)iVar2);
    local_1e8 = local_1b0;
    local_1f0 = (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 *)local_238;
    local_1e0 = local_f8 + 0x28;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_1d0,
               (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                *)&local_1f0);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_1c0 * local_1c0 + local_1d0 * local_1d0 + dStack_1c8 * dStack_1c8;
    auVar8 = vsqrtsd_avx(auVar8,auVar8);
    local_228.m_other = auVar8._0_8_;
    local_238._0_8_ = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_1d0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)&local_1d0,
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)local_238);
    if (this->_indices->_useIndices != false) {
      iVar5 = *(int *)((long)(this->_indices->_indices->
                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar3);
    }
    (*this->_adapter->_vptr_AbsoluteAdapterBase[2])(local_238,this->_adapter,(long)iVar5);
    local_1f0 = (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 *)&local_1d0;
    local_1e8 = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_238;
    SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base *)&local_1f0);
    lVar4 = lVar4 + 0x100000000;
    (fvec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data[uVar6] =
         1.0 - SVar7;
  }
  return 0;
}

Assistant:

int operator()(const VectorXd &x, VectorXd &fvec) const
  {
    assert( x.size() == 6 );
    assert( (unsigned int) fvec.size() == _indices.size());

    //compute the current position
    translation_t translation = x.block<3,1>(0,0);
    cayley_t cayley = x.block<3,1>(3,0);
    rotation_t rotation = math::cayley2rot(cayley);

    //compute inverse transformation
    transformation_t inverseSolution;
    inverseSolution.block<3,3>(0,0) = rotation.transpose();
    inverseSolution.col(3) = -inverseSolution.block<3,3>(0,0)*translation;

    Eigen::Matrix<double,4,1> p_hom;
    p_hom[3] = 1.0;

    for(size_t i = 0; i < _indices.size(); i++)
    {
      //get point in homogeneous form
      p_hom.block<3,1>(0,0) = _adapter.getPoint(_indices[i]);

      //compute the reprojection (this is working for both central and
      //non-central case)
      point_t bodyReprojection = inverseSolution * p_hom;
      point_t reprojection = _adapter.getCamRotation(_indices[i]).transpose() *
          (bodyReprojection - _adapter.getCamOffset(_indices[i]));
      reprojection = reprojection / reprojection.norm();

      //compute the score
      double factor = 1.0;
      fvec[i] = factor *
          (1.0 -
          (reprojection.transpose() * _adapter.getBearingVector(_indices[i])));
    }

    return 0;
  }